

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

int rec_profile_need(jit_State *J,GCproto *pt,BCIns *pc)

{
  int iVar1;
  GCproto *pGVar2;
  BCLine BVar3;
  BCLine pline;
  BCLine line;
  GCproto *ppt;
  BCIns *pc_local;
  GCproto *pt_local;
  jit_State *J_local;
  
  if (pt == (GCproto *)0x0) {
    J_local._4_4_ = 0;
  }
  else {
    pGVar2 = J->prev_pt;
    J->prev_pt = pt;
    if ((pt == pGVar2) || (pGVar2 == (GCproto *)0x0)) {
      if (J->prof_mode == 0x6c) {
        BVar3 = lj_debug_line(pt,(BCPos)((long)pc - (long)(pt + 1) >> 2));
        iVar1 = J->prev_line;
        J->prev_line = BVar3;
        if (iVar1 != BVar3) {
          return 1;
        }
      }
      J_local._4_4_ = 0;
    }
    else {
      J->prev_line = -1;
      J_local._4_4_ = 1;
    }
  }
  return J_local._4_4_;
}

Assistant:

static int rec_profile_need(jit_State *J, GCproto *pt, const BCIns *pc)
{
  GCproto *ppt;
  lj_assertJ(J->prof_mode == 'f' || J->prof_mode == 'l',
	     "bad profiler mode %c", J->prof_mode);
  if (!pt)
    return 0;
  ppt = J->prev_pt;
  J->prev_pt = pt;
  if (pt != ppt && ppt) {
    J->prev_line = -1;
    return 1;
  }
  if (J->prof_mode == 'l') {
    BCLine line = lj_debug_line(pt, proto_bcpos(pt, pc));
    BCLine pline = J->prev_line;
    J->prev_line = line;
    if (pline != line)
      return 1;
  }
  return 0;
}